

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O0

void __thiscall QAssociativeIterable::removeKey(QAssociativeIterable *this,QVariant *key)

{
  long lVar1;
  QMetaType value;
  void *key_00;
  QMetaType *in_RSI;
  QVariantTypeCoercer *in_RDI;
  long in_FS_OFFSET;
  QMetaAssociation meta;
  QVariantTypeCoercer keyCoercer;
  QIterable<QMetaAssociation> *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QIterable<QMetaAssociation>::metaContainer(in_stack_ffffffffffffff80);
  QtPrivate::QVariantTypeCoercer::QVariantTypeCoercer((QVariantTypeCoercer *)0x333cdb);
  QIterable<QMetaAssociation>::mutableIterable((QIterable<QMetaAssociation> *)0x333ce5);
  value = QMetaAssociation::keyMetaType((QMetaAssociation *)in_stack_ffffffffffffff80);
  key_00 = QtPrivate::QVariantTypeCoercer::coerce(in_RDI,(QVariant *)value.d_ptr,in_RSI);
  QMetaAssociation::removeKey((QMetaAssociation *)value.d_ptr,in_RSI,key_00);
  QtPrivate::QVariantTypeCoercer::~QVariantTypeCoercer((QVariantTypeCoercer *)0x333d4c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAssociativeIterable::removeKey(const QVariant &key)
{
    QMetaAssociation meta = metaContainer();
    QtPrivate::QVariantTypeCoercer keyCoercer;
    meta.removeKey(mutableIterable(), keyCoercer.coerce(key, meta.keyMetaType()));
}